

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

_Bool ray_intersect_segments
                (vec3 ro,vec3 rd,vec3 *p0,vec3 *p1,float *radius,int num_segments,float *t,int *idx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec3 q2;
  vec3 p2;
  long lVar5;
  float fVar6;
  vec3 q1;
  undefined1 local_a0 [4];
  float dist;
  vec3 c1;
  vec3 c0;
  float t0;
  float s0;
  int i;
  float min_t;
  int *idx_local;
  float *t_local;
  int num_segments_local;
  float *radius_local;
  vec3 *p1_local;
  vec3 *p0_local;
  vec3 rd_local;
  vec3 ro_local;
  
  s0 = 3.4028235e+38;
  for (t0 = 0.0; (int)t0 < num_segments; t0 = (float)((int)t0 + 1)) {
    q1 = vec3_add(ro,rd);
    lVar5 = (long)(int)t0;
    uVar1 = p0[lVar5].x;
    uVar3 = p0[lVar5].y;
    p2.y = (float)uVar3;
    p2.x = (float)uVar1;
    p2.z = p0[lVar5].z;
    uVar2 = p1[lVar5].x;
    uVar4 = p1[lVar5].y;
    q2.y = (float)uVar4;
    q2.x = (float)uVar2;
    q2.z = p1[lVar5].z;
    fVar6 = closest_point_ray_segment(ro,q1,p2,q2,&c0.z,&c0.y,(vec3 *)&c1.y,(vec3 *)local_a0);
    if ((fVar6 < radius[(int)t0] * radius[(int)t0]) && (c0.z < s0)) {
      s0 = c0.z;
      *idx = (int)t0;
    }
  }
  *t = s0;
  return s0 < 3.4028235e+38;
}

Assistant:

bool ray_intersect_segments(vec3 ro, vec3 rd, vec3 *p0, vec3 *p1, float *radius, int num_segments, float *t, int *idx) {
    float min_t = FLT_MAX;

    for (int i = 0; i < num_segments; i++) {
        float s0, t0;
        vec3 c0, c1;
        float dist = closest_point_ray_segment(ro, vec3_add(ro, rd), p0[i], p1[i], &s0, &t0, &c0, &c1);
        if (dist < radius[i] * radius[i]) {
            if (s0 < min_t) {
                min_t = s0;
                *idx = i;
            }
        }
    }

    *t = min_t;
    return min_t < FLT_MAX;
}